

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# op.cc
# Opt level: O3

void __thiscall PcodeOp::insertInput(PcodeOp *this,int4 slot)

{
  vector<Varnode_*,_std::allocator<Varnode_*>_> *this_00;
  iterator __position;
  pointer ppVVar1;
  ulong uVar2;
  int iVar3;
  pointer ppVVar4;
  ulong uVar5;
  ulong uVar6;
  Varnode *local_20;
  
  this_00 = &this->inrefs;
  local_20 = (Varnode *)0x0;
  __position._M_current =
       (this->inrefs).super__Vector_base<Varnode_*,_std::allocator<Varnode_*>_>._M_impl.
       super__Vector_impl_data._M_finish;
  if (__position._M_current ==
      (this->inrefs).super__Vector_base<Varnode_*,_std::allocator<Varnode_*>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<Varnode*,std::allocator<Varnode*>>::_M_realloc_insert<Varnode*>
              ((vector<Varnode*,std::allocator<Varnode*>> *)this_00,__position,&local_20);
    ppVVar1 = (this->inrefs).super__Vector_base<Varnode_*,_std::allocator<Varnode_*>_>._M_impl.
              super__Vector_impl_data._M_finish;
  }
  else {
    *__position._M_current = (Varnode *)0x0;
    ppVVar1 = (this->inrefs).super__Vector_base<Varnode_*,_std::allocator<Varnode_*>_>._M_impl.
              super__Vector_impl_data._M_finish + 1;
    (this->inrefs).super__Vector_base<Varnode_*,_std::allocator<Varnode_*>_>._M_impl.
    super__Vector_impl_data._M_finish = ppVVar1;
  }
  ppVVar4 = (this_00->super__Vector_base<Varnode_*,_std::allocator<Varnode_*>_>)._M_impl.
            super__Vector_impl_data._M_start;
  uVar2 = (ulong)((long)ppVVar1 - (long)ppVVar4) >> 3;
  iVar3 = (int)uVar2 + -1;
  if (slot < iVar3) {
    uVar5 = (long)iVar3;
    do {
      ppVVar1 = (this_00->super__Vector_base<Varnode_*,_std::allocator<Varnode_*>_>)._M_impl.
                super__Vector_impl_data._M_start;
      ppVVar1[uVar5] =
           *(Varnode **)((long)ppVVar1 + ((long)((uVar2 << 0x20) + -0x200000000) >> 0x1d));
      uVar6 = uVar5 - 1;
      uVar2 = uVar5;
      uVar5 = uVar6;
    } while ((long)slot < (long)uVar6);
    ppVVar4 = (this_00->super__Vector_base<Varnode_*,_std::allocator<Varnode_*>_>)._M_impl.
              super__Vector_impl_data._M_start;
  }
  ppVVar4[slot] = (Varnode *)0x0;
  return;
}

Assistant:

void PcodeOp::insertInput(int4 slot)

{
  inrefs.push_back((Varnode *)0);
  for(int4 i=inrefs.size()-1;i>slot;--i)
    inrefs[i] = inrefs[i-1];
  inrefs[slot] = (Varnode *)0;
}